

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O1

uint64_t protozero::detail::decode_varint_impl(char **data,char *end)

{
  uint uVar1;
  uint64_t uVar2;
  undefined8 *puVar3;
  byte bVar4;
  byte *pbVar5;
  byte *pbVar6;
  pointer_____offset_0x10___ *ppuVar7;
  ulong uVar8;
  byte bVar9;
  bool bVar10;
  
  pbVar6 = (byte *)*data;
  if ((long)end - (long)pbVar6 < 10) {
    bVar10 = pbVar6 == (byte *)end;
    if (!bVar10) {
      bVar9 = *pbVar6;
      bVar4 = 0;
      if ((char)bVar9 < '\0') {
        uVar8 = 0;
        do {
          pbVar6 = pbVar6 + 1;
          bVar10 = pbVar6 == (byte *)end;
          if (bVar10) goto LAB_00167f1c;
          uVar8 = uVar8 | (ulong)(bVar9 & 0x7f) << (bVar4 & 0x3f);
          bVar4 = bVar4 + 7;
          bVar9 = *pbVar6;
        } while ((char)bVar9 < '\0');
      }
      else {
        uVar8 = 0;
      }
      if (!bVar10) {
        pbVar5 = pbVar6 + 1;
        uVar2 = (long)(char)*pbVar6 << (bVar4 & 0x3f) | uVar8;
        goto LAB_00167e3f;
      }
    }
LAB_00167f1c:
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_001a9788;
    ppuVar7 = &end_of_buffer_exception::typeinfo;
LAB_00167f37:
    __cxa_throw(puVar3,ppuVar7,std::exception::~exception);
  }
  uVar1 = *pbVar6 & 0x7f;
  uVar2 = (uint64_t)uVar1;
  if ((char)*pbVar6 < '\0') {
    uVar1 = uVar1 | (pbVar6[1] & 0x7f) << 7;
    uVar2 = (uint64_t)uVar1;
    if ((char)pbVar6[1] < '\0') {
      uVar1 = uVar1 | (pbVar6[2] & 0x7f) << 0xe;
      uVar2 = (uint64_t)uVar1;
      if ((char)pbVar6[2] < '\0') {
        uVar2 = (uint64_t)(uVar1 | (pbVar6[3] & 0x7f) << 0x15);
        if ((char)pbVar6[3] < '\0') {
          uVar2 = uVar2 | (ulong)(pbVar6[4] & 0x7f) << 0x1c;
          if ((char)pbVar6[4] < '\0') {
            uVar2 = uVar2 | (ulong)(pbVar6[5] & 0x7f) << 0x23;
            if ((char)pbVar6[5] < '\0') {
              uVar2 = uVar2 | (ulong)(pbVar6[6] & 0x7f) << 0x2a;
              if ((char)pbVar6[6] < '\0') {
                uVar2 = uVar2 | (ulong)(pbVar6[7] & 0x7f) << 0x31;
                if ((char)pbVar6[7] < '\0') {
                  pbVar5 = pbVar6 + 9;
                  uVar2 = uVar2 | (ulong)(pbVar6[8] & 0x7f) << 0x38;
                  if ((char)pbVar6[8] < '\0') {
                    if ((long)(char)*pbVar5 < 0) {
                      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
                      *puVar3 = &PTR__exception_001a9760;
                      ppuVar7 = &varint_too_long_exception::typeinfo;
                      goto LAB_00167f37;
                    }
                    uVar2 = uVar2 | (long)(char)*pbVar5 << 0x3f;
                    pbVar5 = pbVar6 + 10;
                  }
                }
                else {
                  pbVar5 = pbVar6 + 8;
                }
              }
              else {
                pbVar5 = pbVar6 + 7;
              }
            }
            else {
              pbVar5 = pbVar6 + 6;
            }
          }
          else {
            pbVar5 = pbVar6 + 5;
          }
        }
        else {
          pbVar5 = pbVar6 + 4;
        }
      }
      else {
        pbVar5 = pbVar6 + 3;
      }
    }
    else {
      pbVar5 = pbVar6 + 2;
    }
  }
  else {
    pbVar5 = pbVar6 + 1;
  }
LAB_00167e3f:
  *data = (char *)pbVar5;
  return uVar2;
}

Assistant:

inline uint64_t decode_varint_impl(const char** data, const char* end) {
        const auto* begin = reinterpret_cast<const int8_t*>(*data);
        const auto* iend = reinterpret_cast<const int8_t*>(end);
        const int8_t* p = begin;
        uint64_t val = 0;

        if (iend - begin >= max_varint_length) {  // fast path
            do {
                int64_t b = *p++;
                          val  = ((static_cast<uint64_t>(b) & 0x7fU)       ); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) <<  7U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 14U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 21U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 28U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 35U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 42U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 49U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 56U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x01U) << 63U); if (b >= 0) { break; }
                throw varint_too_long_exception{};
            } while (false);
        } else {
            unsigned int shift = 0;
            while (p != iend && *p < 0) {
                val |= (static_cast<uint64_t>(*p++) & 0x7fU) << shift;
                shift += 7;
            }
            if (p == iend) {
                throw end_of_buffer_exception{};
            }
            val |= static_cast<uint64_t>(*p++) << shift;
        }

        *data = reinterpret_cast<const char*>(p);
        return val;
    }